

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Array
          (Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  
  pbVar1 = this->ptr;
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pbVar1,0x20,sVar2,sVar2,
               ArrayDisposer::
               Dispose_<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ::destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }